

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyd_lyb_data_length(char *data)

{
  int iVar1;
  int iVar2;
  ly_in *in;
  uint32_t uVar3;
  ly_in **pplVar4;
  LY_ERR LVar5;
  lylyb_ctx *lybctx;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint32_t len;
  uint8_t zero [2];
  uint32_t feat_count;
  ly_in **pplStack_10048;
  uint uStack_1003c;
  uint8_t buf [65535];
  
  len = 0;
  zero[0] = '\0';
  zero[1] = '\0';
  if (data == (char *)0x0) {
    return -1;
  }
  lybctx = (lylyb_ctx *)calloc(1,0x38);
  if (lybctx == (lylyb_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_lyb_data_length");
    return 1;
  }
  LVar5 = ly_in_new_memory(data,&lybctx->in);
  if ((LVar5 != LY_SUCCESS) || (LVar5 = lyb_parse_magic_number(lybctx), LVar5 != LY_SUCCESS))
  goto LAB_001372ca;
  LVar5 = lyb_parse_header(lybctx);
  uVar8 = 0;
  if (LVar5 != LY_SUCCESS) goto LAB_001372cd;
  pplStack_10048 = &lybctx->in;
  lyb_read_number(&uStack_1003c,4,2,lybctx);
  for (; pplVar4 = pplStack_10048, uVar8 < uStack_1003c; uVar8 = uVar8 + 1) {
    lyb_read_number(&len,4,2,lybctx);
    lyb_read(buf,(ulong)len,lybctx);
    lyb_read(buf,2,lybctx);
    lyb_read_number(&feat_count,4,2,lybctx);
    uVar3 = feat_count;
    for (uVar7 = 0; uVar7 < uVar3; uVar7 = uVar7 + 1) {
      lyb_read_number(&len,4,2,lybctx);
      lyb_read(buf,(ulong)len,lybctx);
    }
  }
  if (zero == *(uint8_t (*) [2])(*pplStack_10048)->current) {
    lyb_read((uint8_t *)0x0,2,lybctx);
LAB_00137449:
    ly_in_skip(*pplVar4,1);
    uVar8 = 1;
  }
  else {
    LVar5 = lyb_read_start_siblings(lybctx);
    if (LVar5 == LY_SUCCESS) {
      lyb_skip_siblings(lybctx);
      LVar5 = lyb_read_stop_siblings(lybctx);
      if (LVar5 == LY_SUCCESS) goto LAB_00137449;
    }
LAB_001372ca:
    uVar8 = 0;
  }
LAB_001372cd:
  in = lybctx->in;
  iVar1 = *(int *)&in->current;
  iVar2 = *(int *)&in->start;
  ly_in_free(in,'\0');
  lylyb_ctx_free(lybctx);
  iVar6 = -1;
  if ((char)uVar8 != '\0') {
    iVar6 = iVar1 - iVar2;
  }
  return iVar6;
}

Assistant:

LIBYANG_API_DEF int
lyd_lyb_data_length(const char *data)
{
    LY_ERR ret = LY_SUCCESS;
    struct lylyb_ctx *lybctx;
    uint32_t count, feat_count, len = 0, i, j;
    uint8_t buf[LYB_SIZE_MAX];
    uint8_t zero[LYB_SIZE_BYTES] = {0};

    if (!data) {
        return -1;
    }

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_RET(!lybctx, LOGMEM(NULL), LY_EMEM);
    ret = ly_in_new_memory(data, &lybctx->in);
    LY_CHECK_GOTO(ret, cleanup);

    /* read magic number */
    ret = lyb_parse_magic_number(lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* read header */
    ret = lyb_parse_header(lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* read model count */
    lyb_read_number(&count, sizeof count, 2, lybctx);

    /* read all models */
    for (i = 0; i < count; ++i) {
        /* module name length */
        lyb_read_number(&len, sizeof len, 2, lybctx);

        /* model name */
        lyb_read(buf, len, lybctx);

        /* revision */
        lyb_read(buf, 2, lybctx);

        /* enabled feature count */
        lyb_read_number(&feat_count, sizeof feat_count, 2, lybctx);

        /* enabled features */
        for (j = 0; j < feat_count; ++j) {
            /* feature name length */
            lyb_read_number(&len, sizeof len, 2, lybctx);

            /* feature name */
            lyb_read(buf, len, lybctx);
        }
    }

    if (memcmp(zero, lybctx->in->current, LYB_SIZE_BYTES)) {
        /* register a new sibling */
        ret = lyb_read_start_siblings(lybctx);
        LY_CHECK_GOTO(ret, cleanup);

        /* skip it */
        lyb_skip_siblings(lybctx);

        /* sibling finished */
        ret = lyb_read_stop_siblings(lybctx);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        lyb_read(NULL, LYB_SIZE_BYTES, lybctx);
    }

    /* read the last zero, parsing finished */
    ly_in_skip(lybctx->in, 1);

cleanup:
    count = lybctx->in->current - lybctx->in->start;

    ly_in_free(lybctx->in, 0);
    lylyb_ctx_free(lybctx);

    return ret ? -1 : (int)count;
}